

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O0

bool __thiscall
cmFileTimeComparisonInternal::FileTimeCompare
          (cmFileTimeComparisonInternal *this,char *f1,char *f2,int *result)

{
  bool bVar1;
  int iVar2;
  undefined1 local_150 [8];
  stat s2;
  stat s1;
  int *result_local;
  char *f2_local;
  char *f1_local;
  cmFileTimeComparisonInternal *this_local;
  
  bVar1 = Stat(this,f1,(stat *)(s2.__glibc_reserved + 2));
  if ((bVar1) && (bVar1 = Stat(this,f2,(stat *)local_150), bVar1)) {
    iVar2 = Compare(this,(stat *)(s2.__glibc_reserved + 2),(stat *)local_150);
    *result = iVar2;
    this_local._7_1_ = true;
  }
  else {
    *result = 0;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileTimeComparisonInternal::FileTimeCompare(const char* f1,
                                                   const char* f2,
                                                   int* result)
{
  // Get the modification time for each file.
  cmFileTimeComparison_Type s1;
  cmFileTimeComparison_Type s2;
  if(this->Stat(f1, &s1) &&
     this->Stat(f2, &s2))
    {
    // Compare the two modification times.
    *result = this->Compare(&s1, &s2);
    return true;
    }
  else
    {
    // No comparison available.  Default to the same time.
    *result = 0;
    return false;
    }
}